

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

uint32_t __thiscall cfd::core::Psbt::GetDataSize(Psbt *this)

{
  wally_psbt *psbt;
  uint32_t uVar1;
  CfdException *this_00;
  int ret;
  size_t size;
  ByteData data;
  int local_4c;
  size_t local_48;
  undefined1 local_40 [32];
  size_t sVar2;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  local_48 = 0;
  if ((psbt == (wally_psbt *)0x0) || (psbt->num_inputs != 0)) {
    local_4c = wally_psbt_get_length(psbt,0,&local_48);
    if (local_4c != 0) {
      local_40._0_8_ = "cfdcore_psbt.cpp";
      local_40._8_4_ = 0x7f6;
      local_40._16_8_ = "GetDataSize";
      logger::log<int&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                        "wally_psbt_get_length NG[{}]",&local_4c);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._0_8_ = local_40 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"psbt get length error.","");
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    uVar1 = (uint32_t)local_48;
  }
  else {
    CreatePsbtOutputOnlyData((ByteData *)local_40,psbt);
    sVar2 = ByteData::GetDataSize((ByteData *)local_40);
    uVar1 = (uint32_t)sVar2;
    if ((pointer)local_40._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_40._0_8_);
    }
  }
  return uVar1;
}

Assistant:

uint32_t Psbt::GetDataSize() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t size = 0;

  if ((psbt_pointer != nullptr) && (psbt_pointer->num_inputs == 0)) {
    auto data = CreatePsbtOutputOnlyData(psbt_pointer);
    return static_cast<uint32_t>(data.GetDataSize());
  }

  int ret = wally_psbt_get_length(psbt_pointer, 0, &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_get_length NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt get length error.");
  }
  return static_cast<uint32_t>(size);
}